

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O2

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  sVar4 = this->m_cachePos;
  if ((sVar4 == this->m_cacheSize) || (this->m_filePos == 0)) {
    bVar3 = readNextBlock(this);
    if (!bVar3) {
      return false;
    }
    sVar4 = this->m_cachePos;
  }
  pcVar2 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar1 = pcVar2[sVar4];
  if ((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) {
    while( true ) {
      sVar4 = sVar4 + 1;
      this->m_cachePos = sVar4;
      if (bVar1 == 10) break;
      bVar1 = pcVar2[sVar4];
    }
    if ((this->m_cacheSize == sVar4) && (bVar3 = readNextBlock(this), !bVar3)) {
      return false;
    }
  }
  lVar6 = 0;
  while( true ) {
    bVar1 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[this->m_cachePos];
    if ((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) {
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = '\n';
      this->m_cachePos = this->m_cachePos + 1;
      return true;
    }
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar6] = bVar1;
    uVar5 = this->m_cachePos + 1;
    this->m_cachePos = uVar5;
    if ((this->m_cacheSize <= uVar5) && (bVar3 = readNextBlock(this), !bVar3)) break;
    lVar6 = lVar6 + 1;
  }
  return false;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextLine(std::vector<T> &buffer) {
    buffer.resize(m_cacheSize);
    if ( isEndOfCache( m_cachePos, m_cacheSize ) || 0 == m_filePos) {
       if (!readNextBlock()) {
          return false;
       }
      }

    if (IsLineEnd(m_cache[m_cachePos])) {
        // skip line end
        while (m_cache[m_cachePos] != '\n') {
            ++m_cachePos;
        }
        ++m_cachePos;
        if ( isEndOfCache( m_cachePos, m_cacheSize ) ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }

    size_t i( 0 );
    while (!IsLineEnd(m_cache[ m_cachePos ])) {
        buffer[i] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= m_cacheSize) {
            if (!readNextBlock()) {
                return false;
            }
        }
    }
    buffer[i] = '\n';
    ++m_cachePos;

    return true;
}